

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *cp)

{
  long in_RSI;
  TPZFileEqnStorage<double> *in_RDI;
  TPZFileEqnStorage<double> *unaff_retaddr;
  TPZAbstractFrontMatrix<double> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZFileEqnStorage<double> *pTVar1;
  
  pTVar1 = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontSym<double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<double> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  (in_RDI->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontMatrix_02542e60;
  TPZFileEqnStorage<double>::TPZFileEqnStorage(unaff_retaddr,pTVar1);
  copy = (TPZVec<int> *)
         &in_RDI[1].fBlockPos.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  TPZFrontSym<double>::TPZFrontSym((TPZFrontSym<double> *)in_RDI,(TPZFrontSym<double> *)copy);
  in_RDI[2].fFileName.field_2._M_allocated_capacity = *(size_type *)(in_RSI + 0x200);
  *(undefined8 *)((long)&in_RDI[2].fFileName.field_2 + 8) = *(undefined8 *)(in_RSI + 0x208);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,copy);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }